

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_defer_push_task_fn(fio_defer_task_s task,fio_task_queue_s *queue)

{
  fio_lock_i fVar1;
  size_t sVar2;
  fio_defer_queue_block_s *pfVar3;
  int *piVar4;
  fio_lock_i ret;
  timespec local_28;
  
  LOCK();
  fVar1 = queue->lock;
  queue->lock = '\x01';
  UNLOCK();
  local_28.tv_sec._0_1_ = fVar1;
  while ((fio_lock_i)local_28.tv_sec != '\0') {
    local_28.tv_sec = 0;
    local_28.tv_nsec = 1;
    nanosleep(&local_28,(timespec *)0x0);
    LOCK();
    fVar1 = queue->lock;
    queue->lock = '\x01';
    UNLOCK();
    local_28.tv_sec._0_1_ = fVar1;
  }
  pfVar3 = queue->writer;
  if ((pfVar3->state != '\0') && (pfVar3->write == pfVar3->read)) {
    if ((queue->static_queue).state == '\x02') {
      pfVar3->next = &queue->static_queue;
    }
    else {
      pfVar3 = (fio_defer_queue_block_s *)fio_malloc(0xfe0);
      queue->writer->next = pfVar3;
      if (pfVar3 == (fio_defer_queue_block_s *)0x0) {
        LOCK();
        fVar1 = queue->lock;
        queue->lock = '\0';
        UNLOCK();
        local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar1);
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:920"
                        );
        }
        kill(0,2);
        piVar4 = __errno_location();
        exit(*piVar4);
      }
    }
    pfVar3 = queue->writer->next;
    queue->writer = pfVar3;
    *(undefined8 *)((long)&pfVar3->write + 1) = 0;
    *(undefined8 *)((long)&pfVar3->read + 1) = 0;
    pfVar3->next = (fio_defer_queue_block_s *)0x0;
    pfVar3->write = 0;
  }
  pfVar3 = queue->writer;
  sVar2 = pfVar3->write;
  pfVar3->write = sVar2 + 1;
  pfVar3->tasks[sVar2].arg2 = task.arg2;
  pfVar3->tasks[sVar2].func = task.func;
  pfVar3->tasks[sVar2].arg1 = task.arg1;
  pfVar3 = queue->writer;
  if (pfVar3->write == 0xa8) {
    pfVar3->write = 0;
    pfVar3->state = '\x01';
  }
  LOCK();
  queue->lock = '\0';
  UNLOCK();
  return;
}

Assistant:

static inline void fio_defer_push_task_fn(fio_defer_task_s task,
                                          fio_task_queue_s *queue) {
  fio_lock(&queue->lock);

  /* test if full */
  if (queue->writer->state && queue->writer->write == queue->writer->read) {
    /* return to static buffer or allocate new buffer */
    if (queue->static_queue.state == 2) {
      queue->writer->next = &queue->static_queue;
    } else {
      queue->writer->next = fio_malloc(sizeof(*queue->writer->next));
      COUNT_ALLOC;
      if (!queue->writer->next)
        goto critical_error;
    }
    queue->writer = queue->writer->next;
    queue->writer->write = 0;
    queue->writer->read = 0;
    queue->writer->state = 0;
    queue->writer->next = NULL;
  }

  /* place task and finish */
  queue->writer->tasks[queue->writer->write++] = task;
  /* cycle buffer */
  if (queue->writer->write == DEFER_QUEUE_BLOCK_COUNT) {
    queue->writer->write = 0;
    queue->writer->state = 1;
  }
  fio_unlock(&queue->lock);
  return;

critical_error:
  fio_unlock(&queue->lock);
  FIO_ASSERT_ALLOC(NULL)
}